

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockMetadata::PrintDetailedMap_UnusedRange
          (VmaBlockMetadata *this,VmaJsonWriter *json,VkDeviceSize offset,VkDeviceSize size)

{
  VmaJsonWriter *in_RCX;
  undefined8 in_RDX;
  VmaJsonWriter *in_RSI;
  char *in_stack_ffffffffffffffd8;
  
  VmaJsonWriter::BeginObject(in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  VmaJsonWriter::WriteString(in_RCX,in_stack_ffffffffffffffd8);
  VmaJsonWriter::WriteNumber(in_RCX,(uint64_t)in_stack_ffffffffffffffd8);
  VmaJsonWriter::WriteString(in_RCX,in_stack_ffffffffffffffd8);
  VmaJsonWriter::WriteString(in_RCX,in_stack_ffffffffffffffd8);
  VmaJsonWriter::WriteString(in_RCX,in_stack_ffffffffffffffd8);
  VmaJsonWriter::WriteNumber(in_RCX,(uint64_t)in_stack_ffffffffffffffd8);
  VmaJsonWriter::EndObject(in_RCX);
  return;
}

Assistant:

void VmaBlockMetadata::PrintDetailedMap_UnusedRange(class VmaJsonWriter& json,
    VkDeviceSize offset, VkDeviceSize size) const
{
    json.BeginObject(true);

    json.WriteString("Offset");
    json.WriteNumber(offset);

    json.WriteString("Type");
    json.WriteString(VMA_SUBALLOCATION_TYPE_NAMES[VMA_SUBALLOCATION_TYPE_FREE]);

    json.WriteString("Size");
    json.WriteNumber(size);

    json.EndObject();
}